

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::enumeratePhysicalDevices
          (TestStatus *__return_storage_ptr__,Context *context)

{
  unsigned_long uVar1;
  undefined8 this;
  qpTestResult code;
  TestContext *this_00;
  TestLog *log_00;
  InstanceInterface *vk;
  VkInstance instance;
  size_type sVar2;
  MessageBuilder *pMVar3;
  const_reference value;
  string local_368;
  CheckIncompleteResult<vk::VkPhysicalDevice_s_*> local_348;
  MessageBuilder local_330;
  unsigned_long local_1b0;
  size_t ndx;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  LogNumber<long> local_130;
  undefined1 local_c0 [8];
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  ResultCollector results;
  TestLog *log;
  Context *context_local;
  
  this_00 = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this_00);
  results.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_70,log_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  vk = Context::getInstanceInterface(context);
  instance = Context::getInstance(context);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)local_c0
             ,vk,instance);
  this = results.m_message.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"NumDevices",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"Number of devices",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"",(allocator<char> *)((long)&ndx + 7));
  sVar2 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                    ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                     local_c0);
  tcu::LogNumber<long>::LogNumber(&local_130,&local_150,&local_178,&local_1a0,QP_KEY_TAG_NONE,sVar2)
  ;
  tcu::TestLog::operator<<((TestLog *)this,&local_130);
  tcu::LogNumber<long>::~LogNumber(&local_130);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx + 7));
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  local_1b0 = 0;
  while( true ) {
    uVar1 = local_1b0;
    sVar2 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                      ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                        *)local_c0);
    if (sVar2 <= uVar1) break;
    tcu::TestLog::operator<<
              (&local_330,(TestLog *)results.m_message.field_2._8_8_,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_330,&local_1b0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x13c7be4);
    value = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
            operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                        *)local_c0,local_1b0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,value);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_330);
    local_1b0 = local_1b0 + 1;
  }
  local_348._vptr_CheckIncompleteResult = (_func_int **)0x0;
  local_348.m_count = 0;
  local_348.m_result = VK_SUCCESS;
  CheckEnumeratePhysicalDevicesIncompleteResult::CheckEnumeratePhysicalDevicesIncompleteResult
            ((CheckEnumeratePhysicalDevicesIncompleteResult *)&local_348);
  sVar2 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::size
                    ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                     local_c0);
  CheckIncompleteResult<vk::VkPhysicalDevice_s_*>::operator()
            (&local_348,context,(ResultCollector *)local_70,sVar2);
  CheckEnumeratePhysicalDevicesIncompleteResult::~CheckEnumeratePhysicalDevicesIncompleteResult
            ((CheckEnumeratePhysicalDevicesIncompleteResult *)&local_348);
  code = tcu::ResultCollector::getResult((ResultCollector *)local_70);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_368,(ResultCollector *)local_70);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)local_c0
            );
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus enumeratePhysicalDevices (Context& context)
{
	TestLog&						log		= context.getTestContext().getLog();
	tcu::ResultCollector			results	(log);
	const vector<VkPhysicalDevice>	devices	= enumeratePhysicalDevices(context.getInstanceInterface(), context.getInstance());

	log << TestLog::Integer("NumDevices", "Number of devices", "", QP_KEY_TAG_NONE, deInt64(devices.size()));

	for (size_t ndx = 0; ndx < devices.size(); ndx++)
		log << TestLog::Message << ndx << ": " << devices[ndx] << TestLog::EndMessage;

	CheckEnumeratePhysicalDevicesIncompleteResult()(context, results, devices.size());

	return tcu::TestStatus(results.getResult(), results.getMessage());
}